

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::cmCTestBuildHandler(cmCTestBuildHandler *this)

{
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_00729de0;
  (this->StartBuild)._M_dataplus._M_p = (pointer)&(this->StartBuild).field_2;
  (this->StartBuild)._M_string_length = 0;
  (this->StartBuild).field_2._M_local_buf[0] = '\0';
  (this->EndBuild)._M_dataplus._M_p = (pointer)&(this->EndBuild).field_2;
  (this->EndBuild)._M_string_length = 0;
  (this->EndBuild).field_2._M_local_buf[0] = '\0';
  memset(&this->CustomErrorMatches,0,0x108);
  std::_Deque_base<char,_std::allocator<char>_>::_Deque_base
            (&(this->BuildProcessingQueue).super__Deque_base<char,_std::allocator<char>_>);
  std::_Deque_base<char,_std::allocator<char>_>::_Deque_base
            (&(this->BuildProcessingErrorQueue).super__Deque_base<char,_std::allocator<char>_>);
  (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CurrentProcessingLine).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SimplifySourceDir)._M_dataplus._M_p = (pointer)&(this->SimplifySourceDir).field_2;
  (this->SimplifySourceDir)._M_string_length = 0;
  (this->SimplifySourceDir).field_2._M_local_buf[0] = '\0';
  (this->SimplifyBuildDir)._M_dataplus._M_p = (pointer)&(this->SimplifyBuildDir).field_2;
  (this->SimplifyBuildDir)._M_string_length = 0;
  (this->SimplifyBuildDir).field_2._M_local_buf[0] = '\0';
  (this->ErrorsAndWarnings).
  super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ErrorsAndWarnings).
  super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ErrorsAndWarnings).
  super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LastErrorOrWarning)._M_current = (cmCTestBuildErrorWarning *)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&(this->PreContext).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  (this->CTestLaunchDir)._M_dataplus._M_p = (pointer)&(this->CTestLaunchDir).field_2;
  (this->CTestLaunchDir)._M_string_length = 0;
  (this->CTestLaunchDir).field_2._M_local_buf[0] = '\0';
  this->MaxPreContext = 10;
  this->MaxPostContext = 10;
  this->MaxErrors = 0x32;
  this->MaxWarnings = 0x32;
  (this->LastErrorOrWarning)._M_current =
       (this->ErrorsAndWarnings).
       super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  this->UseCTestLaunch = false;
  return;
}

Assistant:

cmCTestBuildHandler::cmCTestBuildHandler()
{
  this->MaxPreContext = 10;
  this->MaxPostContext = 10;

  this->MaxErrors = 50;
  this->MaxWarnings = 50;

  this->LastErrorOrWarning = this->ErrorsAndWarnings.end();

  this->UseCTestLaunch = false;
}